

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs.c
# Opt level: O3

int run_test_fs_async_dir(void)

{
  int iVar1;
  int extraout_EAX;
  int extraout_EAX_00;
  int extraout_EAX_01;
  int extraout_EAX_02;
  int extraout_EAX_03;
  int extraout_EAX_04;
  uv_fs_t *loop;
  uv_loop_t *loop_00;
  char *pcVar2;
  uv_fs_t *puVar3;
  char *unaff_R12;
  uv_fs_t *unaff_R14;
  uv_dirent_t *unaff_R15;
  uv_dirent_t dent_00;
  uv_dirent_t dent_01;
  uv_dirent_t dent;
  uv_dirent_t uStack_78;
  uv_loop_t *puStack_68;
  char *pcStack_60;
  uv_fs_t *puStack_50;
  code *pcStack_48;
  code *pcStack_40;
  uv_dirent_t local_38;
  
  pcStack_40 = (code *)0x159818;
  unlink("test_dir/file1");
  pcStack_40 = (code *)0x159824;
  unlink("test_dir/file2");
  loop_00 = (uv_loop_t *)0x1a3609;
  pcStack_40 = (code *)0x159833;
  rmdir("test_dir");
  pcStack_40 = (code *)0x159838;
  loop = (uv_fs_t *)uv_default_loop();
  pcStack_40 = (code *)0x15985d;
  ::loop = (uv_loop_t *)loop;
  iVar1 = uv_fs_mkdir((uv_loop_t *)loop,&mkdir_req,"test_dir",0x1ed,mkdir_cb);
  if (iVar1 == 0) {
    pcStack_40 = (code *)0x159873;
    loop = (uv_fs_t *)::loop;
    uv_run(::loop,UV_RUN_DEFAULT);
    if (mkdir_cb_count != 1) goto LAB_00159c80;
    loop = (uv_fs_t *)0x0;
    pcStack_40 = (code *)0x1598a3;
    iVar1 = uv_fs_open((uv_loop_t *)0x0,&open_req1,"test_dir/file1",0x41,0x180,(uv_fs_cb)0x0);
    if (iVar1 < 0) goto LAB_00159c85;
    pcStack_40 = (code *)0x1598b7;
    uv_fs_req_cleanup(&open_req1);
    loop = (uv_fs_t *)0x0;
    pcStack_40 = (code *)0x1598cd;
    iVar1 = uv_fs_close((uv_loop_t *)0x0,&close_req,(uv_file)open_req1.result,(uv_fs_cb)0x0);
    if (iVar1 != 0) goto LAB_00159c8a;
    pcStack_40 = (code *)0x1598e1;
    uv_fs_req_cleanup(&close_req);
    loop = (uv_fs_t *)0x0;
    pcStack_40 = (code *)0x159904;
    iVar1 = uv_fs_open((uv_loop_t *)0x0,&open_req1,"test_dir/file2",0x41,0x180,(uv_fs_cb)0x0);
    if (iVar1 < 0) goto LAB_00159c8f;
    pcStack_40 = (code *)0x159918;
    uv_fs_req_cleanup(&open_req1);
    loop = (uv_fs_t *)0x0;
    pcStack_40 = (code *)0x15992e;
    iVar1 = uv_fs_close((uv_loop_t *)0x0,&close_req,(uv_file)open_req1.result,(uv_fs_cb)0x0);
    if (iVar1 != 0) goto LAB_00159c94;
    pcStack_40 = (code *)0x159942;
    uv_fs_req_cleanup(&close_req);
    pcStack_40 = (code *)0x159965;
    loop = (uv_fs_t *)::loop;
    iVar1 = uv_fs_scandir(::loop,&scandir_req,"test_dir",0,scandir_cb);
    if (iVar1 != 0) goto LAB_00159c99;
    pcStack_40 = (code *)0x15997b;
    loop = (uv_fs_t *)::loop;
    uv_run(::loop,UV_RUN_DEFAULT);
    if (scandir_cb_count != 1) goto LAB_00159c9e;
    loop = (uv_fs_t *)0x0;
    pcStack_40 = (code *)0x1599a2;
    iVar1 = uv_fs_scandir((uv_loop_t *)0x0,&scandir_req,"test_dir",0,(uv_fs_cb)0x0);
    if (iVar1 != 2) goto LAB_00159ca3;
    if (scandir_req.result != 2) goto LAB_00159ca8;
    if (scandir_req.ptr == (void *)0x0) goto LAB_00159cad;
    pcStack_40 = (code *)0x1599d6;
    iVar1 = uv_fs_scandir_next(&scandir_req,&local_38);
    if (iVar1 != -0xfff) {
      loop_00 = (uv_loop_t *)0x1a20e8;
      unaff_R14 = &scandir_req;
      unaff_R12 = "file2";
      do {
        loop = (uv_fs_t *)local_38.name;
        pcVar2 = "file1";
        pcStack_40 = (code *)0x159a04;
        iVar1 = strcmp(local_38.name,"file1");
        if (iVar1 != 0) {
          pcVar2 = "file2";
          pcStack_40 = (code *)0x159a13;
          iVar1 = strcmp((char *)loop,"file2");
          if (iVar1 != 0) {
            pcStack_40 = (code *)0x159c7b;
            run_test_fs_async_dir_cold_11();
            unaff_R15 = &local_38;
            goto LAB_00159c7b;
          }
        }
        dent_00.name = (char *)(ulong)local_38.type;
        pcStack_40 = (code *)0x159a24;
        dent_00._8_8_ = pcVar2;
        assert_is_file_type(dent_00);
        pcStack_40 = (code *)0x159a2f;
        iVar1 = uv_fs_scandir_next(&scandir_req,&local_38);
        unaff_R15 = &local_38;
      } while (iVar1 != -0xfff);
    }
    loop = &scandir_req;
    pcStack_40 = (code *)0x159a42;
    uv_fs_req_cleanup(&scandir_req);
    if (scandir_req.ptr != (void *)0x0) goto LAB_00159cb2;
    pcStack_40 = (code *)0x159a71;
    loop = (uv_fs_t *)::loop;
    iVar1 = uv_fs_stat(::loop,&stat_req,"test_dir",stat_cb);
    if (iVar1 != 0) goto LAB_00159cb7;
    pcStack_40 = (code *)0x159a87;
    uv_run(::loop,UV_RUN_DEFAULT);
    pcStack_40 = (code *)0x159aa8;
    loop = (uv_fs_t *)::loop;
    iVar1 = uv_fs_stat(::loop,&stat_req,"test_dir/",stat_cb);
    if (iVar1 != 0) goto LAB_00159cbc;
    pcStack_40 = (code *)0x159abe;
    uv_run(::loop,UV_RUN_DEFAULT);
    pcStack_40 = (code *)0x159adf;
    loop = (uv_fs_t *)::loop;
    iVar1 = uv_fs_lstat(::loop,&stat_req,"test_dir",stat_cb);
    if (iVar1 != 0) goto LAB_00159cc1;
    pcStack_40 = (code *)0x159af5;
    uv_run(::loop,UV_RUN_DEFAULT);
    pcStack_40 = (code *)0x159b16;
    loop = (uv_fs_t *)::loop;
    iVar1 = uv_fs_lstat(::loop,&stat_req,"test_dir/",stat_cb);
    if (iVar1 != 0) goto LAB_00159cc6;
    pcStack_40 = (code *)0x159b2c;
    loop = (uv_fs_t *)::loop;
    uv_run(::loop,UV_RUN_DEFAULT);
    if (stat_cb_count != 4) goto LAB_00159ccb;
    pcStack_40 = (code *)0x159b5a;
    loop = (uv_fs_t *)::loop;
    iVar1 = uv_fs_unlink(::loop,&unlink_req,"test_dir/file1",unlink_cb);
    if (iVar1 != 0) goto LAB_00159cd0;
    pcStack_40 = (code *)0x159b70;
    loop = (uv_fs_t *)::loop;
    uv_run(::loop,UV_RUN_DEFAULT);
    if (unlink_cb_count != 1) goto LAB_00159cd5;
    pcStack_40 = (code *)0x159b9e;
    loop = (uv_fs_t *)::loop;
    iVar1 = uv_fs_unlink(::loop,&unlink_req,"test_dir/file2",unlink_cb);
    if (iVar1 != 0) goto LAB_00159cda;
    pcStack_40 = (code *)0x159bb4;
    loop = (uv_fs_t *)::loop;
    uv_run(::loop,UV_RUN_DEFAULT);
    if (unlink_cb_count != 2) goto LAB_00159cdf;
    pcStack_40 = (code *)0x159be2;
    loop = (uv_fs_t *)::loop;
    iVar1 = uv_fs_rmdir(::loop,&rmdir_req,"test_dir",rmdir_cb);
    if (iVar1 != 0) goto LAB_00159ce4;
    pcStack_40 = (code *)0x159bf8;
    loop = (uv_fs_t *)::loop;
    uv_run(::loop,UV_RUN_DEFAULT);
    if (rmdir_cb_count != 1) goto LAB_00159ce9;
    pcStack_40 = (code *)0x159c11;
    unlink("test_dir/file1");
    pcStack_40 = (code *)0x159c1d;
    unlink("test_dir/file2");
    pcStack_40 = (code *)0x159c29;
    rmdir("test_dir");
    pcStack_40 = (code *)0x159c2e;
    loop_00 = uv_default_loop();
    pcStack_40 = (code *)0x159c42;
    uv_walk(loop_00,close_walk_cb,(void *)0x0);
    pcStack_40 = (code *)0x159c4c;
    uv_run(loop_00,UV_RUN_DEFAULT);
    pcStack_40 = (code *)0x159c51;
    loop = (uv_fs_t *)uv_default_loop();
    pcStack_40 = (code *)0x159c59;
    iVar1 = uv_loop_close((uv_loop_t *)loop);
    if (iVar1 == 0) {
      pcStack_40 = (code *)0x159c66;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
LAB_00159c7b:
    pcStack_40 = (code *)0x159c80;
    run_test_fs_async_dir_cold_1();
LAB_00159c80:
    pcStack_40 = (code *)0x159c85;
    run_test_fs_async_dir_cold_2();
LAB_00159c85:
    pcStack_40 = (code *)0x159c8a;
    run_test_fs_async_dir_cold_3();
LAB_00159c8a:
    pcStack_40 = (code *)0x159c8f;
    run_test_fs_async_dir_cold_4();
LAB_00159c8f:
    pcStack_40 = (code *)0x159c94;
    run_test_fs_async_dir_cold_5();
LAB_00159c94:
    pcStack_40 = (code *)0x159c99;
    run_test_fs_async_dir_cold_6();
LAB_00159c99:
    pcStack_40 = (code *)0x159c9e;
    run_test_fs_async_dir_cold_7();
LAB_00159c9e:
    pcStack_40 = (code *)0x159ca3;
    run_test_fs_async_dir_cold_8();
LAB_00159ca3:
    pcStack_40 = (code *)0x159ca8;
    run_test_fs_async_dir_cold_9();
LAB_00159ca8:
    pcStack_40 = (code *)0x159cad;
    run_test_fs_async_dir_cold_10();
LAB_00159cad:
    pcStack_40 = (code *)0x159cb2;
    run_test_fs_async_dir_cold_25();
LAB_00159cb2:
    pcStack_40 = (code *)0x159cb7;
    run_test_fs_async_dir_cold_12();
LAB_00159cb7:
    pcStack_40 = (code *)0x159cbc;
    run_test_fs_async_dir_cold_13();
LAB_00159cbc:
    pcStack_40 = (code *)0x159cc1;
    run_test_fs_async_dir_cold_14();
LAB_00159cc1:
    pcStack_40 = (code *)0x159cc6;
    run_test_fs_async_dir_cold_15();
LAB_00159cc6:
    pcStack_40 = (code *)0x159ccb;
    run_test_fs_async_dir_cold_16();
LAB_00159ccb:
    pcStack_40 = (code *)0x159cd0;
    run_test_fs_async_dir_cold_17();
LAB_00159cd0:
    pcStack_40 = (code *)0x159cd5;
    run_test_fs_async_dir_cold_18();
LAB_00159cd5:
    pcStack_40 = (code *)0x159cda;
    run_test_fs_async_dir_cold_19();
LAB_00159cda:
    pcStack_40 = (code *)0x159cdf;
    run_test_fs_async_dir_cold_20();
LAB_00159cdf:
    pcStack_40 = (code *)0x159ce4;
    run_test_fs_async_dir_cold_21();
LAB_00159ce4:
    pcStack_40 = (code *)0x159ce9;
    run_test_fs_async_dir_cold_22();
LAB_00159ce9:
    pcStack_40 = (code *)0x159cee;
    run_test_fs_async_dir_cold_23();
  }
  pcStack_40 = mkdir_cb;
  run_test_fs_async_dir_cold_24();
  if (loop == &mkdir_req) {
    if (mkdir_req.fs_type != UV_FS_MKDIR) goto LAB_00159d4d;
    if (mkdir_req.result != 0) goto LAB_00159d52;
    mkdir_cb_count = mkdir_cb_count + 1;
    if (mkdir_req.path == (char *)0x0) goto LAB_00159d57;
    if (mkdir_req.path[8] == '\0' && *(long *)mkdir_req.path == 0x7269645f74736574) {
      uv_fs_req_cleanup(&mkdir_req);
      return extraout_EAX;
    }
  }
  else {
    pcStack_48 = (code *)0x159d4d;
    mkdir_cb_cold_1();
LAB_00159d4d:
    pcStack_48 = (code *)0x159d52;
    mkdir_cb_cold_2();
LAB_00159d52:
    pcStack_48 = (code *)0x159d57;
    mkdir_cb_cold_3();
LAB_00159d57:
    pcStack_48 = (code *)0x159d5c;
    mkdir_cb_cold_5();
  }
  pcStack_48 = scandir_cb;
  mkdir_cb_cold_4();
  puStack_68 = loop_00;
  pcStack_60 = unaff_R12;
  puStack_50 = unaff_R14;
  pcStack_48 = (code *)unaff_R15;
  if (loop == &scandir_req) {
    puVar3 = loop;
    if (scandir_req.fs_type != UV_FS_SCANDIR) goto LAB_00159e68;
    if (scandir_req.result != 2) goto LAB_00159e6d;
    if (scandir_req.ptr == (void *)0x0) goto LAB_00159e72;
    puVar3 = &scandir_req;
    iVar1 = uv_fs_scandir_next(&scandir_req,&uStack_78);
    loop = (uv_fs_t *)uStack_78.name;
    while (iVar1 != -0xfff) {
      pcVar2 = "file1";
      uStack_78.name = (char *)loop;
      iVar1 = strcmp((char *)loop,"file1");
      if (iVar1 != 0) {
        pcVar2 = "file2";
        iVar1 = strcmp((char *)loop,"file2");
        if (iVar1 != 0) {
          scandir_cb_cold_4();
          goto LAB_00159e63;
        }
      }
      dent_01.name = (char *)(ulong)uStack_78.type;
      dent_01._8_8_ = pcVar2;
      assert_is_file_type(dent_01);
      puVar3 = &scandir_req;
      iVar1 = uv_fs_scandir_next(&scandir_req,&uStack_78);
      loop = (uv_fs_t *)uStack_78.name;
    }
    scandir_cb_count = scandir_cb_count + 1;
    if ((long *)scandir_req.path == (long *)0x0) goto LAB_00159e77;
    if ((char)*(long *)((long)scandir_req.path + 8) != '\0' ||
        *(long *)scandir_req.path != 0x7269645f74736574) goto LAB_00159e7c;
    puVar3 = &scandir_req;
    uv_fs_req_cleanup(&scandir_req);
    if (scandir_req.ptr == (void *)0x0) {
      return extraout_EAX_00;
    }
  }
  else {
LAB_00159e63:
    scandir_cb_cold_1();
    puVar3 = loop;
LAB_00159e68:
    scandir_cb_cold_2();
LAB_00159e6d:
    scandir_cb_cold_3();
LAB_00159e72:
    scandir_cb_cold_8();
LAB_00159e77:
    scandir_cb_cold_7();
LAB_00159e7c:
    scandir_cb_cold_5();
  }
  scandir_cb_cold_6();
  if ((uint)puVar3 < 2) {
    return extraout_EAX_01;
  }
  assert_is_file_type_cold_1();
  if (puVar3 == &stat_req) {
    if ((stat_req.fs_type & ~UV_FS_OPEN) != UV_FS_STAT) goto LAB_00159ee4;
    if (stat_req.result != 0) goto LAB_00159ee9;
    if (stat_req.ptr == (void *)0x0) goto LAB_00159eee;
    stat_cb_count = stat_cb_count + 1;
    puVar3 = &stat_req;
    uv_fs_req_cleanup(&stat_req);
    if (stat_req.ptr == (void *)0x0) {
      return extraout_EAX_02;
    }
  }
  else {
    stat_cb_cold_1();
LAB_00159ee4:
    stat_cb_cold_2();
LAB_00159ee9:
    stat_cb_cold_3();
LAB_00159eee:
    stat_cb_cold_5();
  }
  stat_cb_cold_4();
  if (puVar3 == &unlink_req) {
    if (unlink_req.fs_type != UV_FS_UNLINK) goto LAB_00159f30;
    if (unlink_req.result == 0) {
      unlink_cb_count = unlink_cb_count + 1;
      uv_fs_req_cleanup(&unlink_req);
      return extraout_EAX_03;
    }
  }
  else {
    unlink_cb_cold_1();
LAB_00159f30:
    unlink_cb_cold_2();
  }
  unlink_cb_cold_3();
  if (puVar3 == &rmdir_req) {
    if (rmdir_req.fs_type != UV_FS_RMDIR) goto LAB_00159f94;
    if (rmdir_req.result != 0) goto LAB_00159f99;
    rmdir_cb_count = rmdir_cb_count + 1;
    if (rmdir_req.path != (char *)0x0) {
      if (rmdir_req.path[8] == '\0' && *(long *)rmdir_req.path == 0x7269645f74736574) {
        uv_fs_req_cleanup(&rmdir_req);
        return extraout_EAX_04;
      }
      goto LAB_00159fa3;
    }
  }
  else {
    rmdir_cb_cold_1();
LAB_00159f94:
    rmdir_cb_cold_2();
LAB_00159f99:
    rmdir_cb_cold_3();
  }
  rmdir_cb_cold_5();
LAB_00159fa3:
  rmdir_cb_cold_4();
  test_sendfile(sendfile_setup,sendfile_cb,0x10009);
  return 0;
}

Assistant:

TEST_IMPL(fs_async_dir) {
  int r;
  uv_dirent_t dent;

  /* Setup */
  unlink("test_dir/file1");
  unlink("test_dir/file2");
  rmdir("test_dir");

  loop = uv_default_loop();

  r = uv_fs_mkdir(loop, &mkdir_req, "test_dir", 0755, mkdir_cb);
  ASSERT(r == 0);

  uv_run(loop, UV_RUN_DEFAULT);
  ASSERT(mkdir_cb_count == 1);

  /* Create 2 files synchronously. */
  r = uv_fs_open(NULL, &open_req1, "test_dir/file1", O_WRONLY | O_CREAT,
      S_IWUSR | S_IRUSR, NULL);
  ASSERT(r >= 0);
  uv_fs_req_cleanup(&open_req1);
  r = uv_fs_close(NULL, &close_req, open_req1.result, NULL);
  ASSERT(r == 0);
  uv_fs_req_cleanup(&close_req);

  r = uv_fs_open(NULL, &open_req1, "test_dir/file2", O_WRONLY | O_CREAT,
      S_IWUSR | S_IRUSR, NULL);
  ASSERT(r >= 0);
  uv_fs_req_cleanup(&open_req1);
  r = uv_fs_close(NULL, &close_req, open_req1.result, NULL);
  ASSERT(r == 0);
  uv_fs_req_cleanup(&close_req);

  r = uv_fs_scandir(loop, &scandir_req, "test_dir", 0, scandir_cb);
  ASSERT(r == 0);

  uv_run(loop, UV_RUN_DEFAULT);
  ASSERT(scandir_cb_count == 1);

  /* sync uv_fs_scandir */
  r = uv_fs_scandir(NULL, &scandir_req, "test_dir", 0, NULL);
  ASSERT(r == 2);
  ASSERT(scandir_req.result == 2);
  ASSERT(scandir_req.ptr);
  while (UV_EOF != uv_fs_scandir_next(&scandir_req, &dent)) {
    ASSERT(strcmp(dent.name, "file1") == 0 || strcmp(dent.name, "file2") == 0);
    assert_is_file_type(dent);
  }
  uv_fs_req_cleanup(&scandir_req);
  ASSERT(!scandir_req.ptr);

  r = uv_fs_stat(loop, &stat_req, "test_dir", stat_cb);
  ASSERT(r == 0);
  uv_run(loop, UV_RUN_DEFAULT);

  r = uv_fs_stat(loop, &stat_req, "test_dir/", stat_cb);
  ASSERT(r == 0);
  uv_run(loop, UV_RUN_DEFAULT);

  r = uv_fs_lstat(loop, &stat_req, "test_dir", stat_cb);
  ASSERT(r == 0);
  uv_run(loop, UV_RUN_DEFAULT);

  r = uv_fs_lstat(loop, &stat_req, "test_dir/", stat_cb);
  ASSERT(r == 0);
  uv_run(loop, UV_RUN_DEFAULT);

  ASSERT(stat_cb_count == 4);

  r = uv_fs_unlink(loop, &unlink_req, "test_dir/file1", unlink_cb);
  ASSERT(r == 0);
  uv_run(loop, UV_RUN_DEFAULT);
  ASSERT(unlink_cb_count == 1);

  r = uv_fs_unlink(loop, &unlink_req, "test_dir/file2", unlink_cb);
  ASSERT(r == 0);
  uv_run(loop, UV_RUN_DEFAULT);
  ASSERT(unlink_cb_count == 2);

  r = uv_fs_rmdir(loop, &rmdir_req, "test_dir", rmdir_cb);
  ASSERT(r == 0);
  uv_run(loop, UV_RUN_DEFAULT);
  ASSERT(rmdir_cb_count == 1);

  /* Cleanup */
  unlink("test_dir/file1");
  unlink("test_dir/file2");
  rmdir("test_dir");

  MAKE_VALGRIND_HAPPY();
  return 0;
}